

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O0

Builder * arangodb::velocypack::Collection::sort
                    (Slice array,
                    function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)>
                    *lessthan)

{
  bool bVar1;
  undefined8 uVar2;
  function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)> *pfVar3;
  int __fd;
  Builder *in_RDI;
  Slice *s;
  iterator __end1;
  iterator __begin1;
  vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_> *__range1;
  ValueLength i;
  ValueLength len;
  vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_> subValues;
  Builder *b;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>
  *in_stack_ffffffffffffff10;
  Builder *this;
  Slice in_stack_ffffffffffffff18;
  Exception *in_stack_ffffffffffffff20;
  function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)> *this_00;
  Builder *this_01;
  Slice *local_b0;
  __normal_iterator<arangodb::velocypack::Slice_*,_std::vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>_>
  in_stack_ffffffffffffff58;
  function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)>
  *in_stack_ffffffffffffff70;
  __normal_iterator<arangodb::velocypack::Slice_*,_std::vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>_>
  in_stack_ffffffffffffff78;
  __normal_iterator<arangodb::velocypack::Slice_*,_std::vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>_>
  in_stack_ffffffffffffff80;
  function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)> *local_58;
  undefined1 local_38 [56];
  
  this_01 = in_RDI;
  bVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::isArray
                    ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x119c4e
                    );
  if (bVar1) {
    std::vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>::vector
              ((vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_> *)
               0x119c9a);
    pfVar3 = (function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)> *)
             SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::length
                       ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                        in_stack_ffffffffffffff58._M_current);
    this_00 = pfVar3;
    local_38._48_8_ = pfVar3;
    std::vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>::reserve
              ((vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_> *)
               this_01,(size_type)in_RDI);
    for (local_58 = (function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)> *)0x0
        ; local_58 < pfVar3;
        local_58 = (function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)> *)
                   ((long)&(local_58->super__Function_base)._M_functor + 1)) {
      in_stack_ffffffffffffff18 =
           SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::operator[]
                     ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                      CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),0x119d15);
      std::vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>::
      push_back(in_stack_ffffffffffffff10,
                (value_type *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    }
    this = (Builder *)local_38;
    std::vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>::begin
              ((vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_> *)
               CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    std::vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>::end
              ((vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_> *)
               CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    std::function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)>::function
              (this_00,(function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)> *)
                       in_stack_ffffffffffffff18._start);
    std::
    sort<__gnu_cxx::__normal_iterator<arangodb::velocypack::Slice*,std::vector<arangodb::velocypack::Slice,std::allocator<arangodb::velocypack::Slice>>>,std::function<bool(arangodb::velocypack::Slice,arangodb::velocypack::Slice)>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    std::function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)>::~function
              ((function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)> *)0x119dd4
              );
    Builder::Builder(this_01);
    Builder::openArray(this,(bool)in_stack_ffffffffffffff0f);
    std::vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>::begin
              ((vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_> *)
               CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    local_b0 = (Slice *)std::
                        vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>
                        ::end((vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>
                               *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    while( true ) {
      __fd = (int)&local_b0;
      bVar1 = __gnu_cxx::
              operator==<arangodb::velocypack::Slice_*,_std::vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>_>
                        ((__normal_iterator<arangodb::velocypack::Slice_*,_std::vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>_>
                          *)this,(__normal_iterator<arangodb::velocypack::Slice_*,_std::vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>_>
                                  *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      __gnu_cxx::
      __normal_iterator<arangodb::velocypack::Slice_*,_std::vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>_>
      ::operator*((__normal_iterator<arangodb::velocypack::Slice_*,_std::vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>_>
                   *)&stack0xffffffffffffff58);
      Builder::add(this,(Slice *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
      __gnu_cxx::
      __normal_iterator<arangodb::velocypack::Slice_*,_std::vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>_>
      ::operator++((__normal_iterator<arangodb::velocypack::Slice_*,_std::vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>_>
                    *)&stack0xffffffffffffff58);
    }
    Builder::close(in_RDI,__fd);
    std::vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>::~vector
              ((vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_> *)
               this_00);
    return this_01;
  }
  uVar2 = __cxa_allocate_exception(0x18);
  Exception::Exception
            (in_stack_ffffffffffffff20,
             (ExceptionType)((ulong)in_stack_ffffffffffffff18._start >> 0x20),
             (char *)in_stack_ffffffffffffff10);
  __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

Builder Collection::sort(
    Slice array,
    std::function<bool(Slice, Slice)> lessthan) {
  if (!array.isArray()) {
    throw Exception(Exception::InvalidValueType, "Expecting type Array");
  }
  std::vector<Slice> subValues;
  ValueLength len = array.length();
  subValues.reserve(checkOverflow(len));
  for (ValueLength i = 0; i < len; i++) {
    subValues.push_back(array[i]);
  }
  std::sort(subValues.begin(), subValues.end(), lessthan);
  Builder b;
  b.openArray();
  for (auto const& s : subValues) {
    b.add(s);
  }
  b.close();
  return b;
}